

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangularTrimmedSurface::~IfcRectangularTrimmedSurface
          (IfcRectangularTrimmedSurface *this)

{
  undefined1 *puVar1;
  
  this[-1].Vsense._M_string_length = 0x99aa88;
  (this->Usense).field_2._M_allocated_capacity = 0x99ab50;
  *(undefined8 *)((long)&this[-1].Vsense.field_2 + 8) = 0x99aab0;
  *(undefined8 *)&this[-1].field_0xc0 = 0x99aad8;
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x99ab00;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x99ab28;
  if ((Out *)this->U2 != &this->Usense) {
    operator_delete((undefined1 *)this->U2);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcBoundedSurface).field_0x48;
  if ((Out *)puVar1 != &this->U1) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].Vsense._M_string_length);
  return;
}

Assistant:

IfcRectangularTrimmedSurface() : Object("IfcRectangularTrimmedSurface") {}